

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O0

void __thiscall
mp::
RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
::ConvertRange(RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
               *this,ItemType *item,int i)

{
  array<int,_3UL> be;
  int iVar1;
  ValueNode *pVVar2;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *in_RSI;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_RDI;
  AlgConRhs<0> rr;
  double r;
  NodeRange NVar3;
  int i1;
  AlgConEQ lceq;
  QuadAndLinTerms body;
  int slk;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff810;
  int in_stack_fffffffffffff814;
  QuadAndLinTerms *in_stack_fffffffffffff818;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff82c;
  undefined1 fSort;
  int iVar4;
  QuadAndLinTerms *in_stack_fffffffffffff830;
  AlgConRhs<0> local_590 [173];
  NodeRange local_28;
  int local_18;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *local_10;
  
  fSort = (undefined1)((uint)in_stack_fffffffffffff82c >> 0x18);
  local_10 = in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::TurnOffAutoLinking
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  rr.rhs_ = AlgConRange::ub(&local_10->super_AlgConRange);
  AlgConRange::lb(&local_10->super_AlgConRange);
  local_28 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddVar(in_stack_fffffffffffff820,(double)in_stack_fffffffffffff818,
                      (double)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                      (Type)((ulong)in_stack_fffffffffffff808 >> 0x20));
  local_18 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x1b9deb);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::GetBody(local_10);
  QuadAndLinTerms::QuadAndLinTerms
            ((QuadAndLinTerms *)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  LinTerms::add_term((LinTerms *)in_stack_fffffffffffff820,(double)in_stack_fffffffffffff818,
                     in_stack_fffffffffffff814);
  QuadAndLinTerms::QuadAndLinTerms
            ((QuadAndLinTerms *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (QuadAndLinTerms *)in_stack_fffffffffffff808);
  r = AlgConRange::ub(&local_10->super_AlgConRange);
  AlgConRhs<0>::AlgConRhs(local_590,r);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (in_RDI,in_stack_fffffffffffff830,rr,(bool)fSort);
  QuadAndLinTerms::~QuadAndLinTerms
            ((QuadAndLinTerms *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
             CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),in_stack_fffffffffffff808
            );
  NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)rr.rhs_,in_RDI);
  pVVar2 = NVar3.pvn_;
  iVar4 = NVar3.ir_.end_;
  iVar1 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x1b9f01);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffff810));
  GetSlackLink((RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
                *)in_RDI);
  be._M_elems._4_8_ = pVVar2;
  be._M_elems[0] = iVar4;
  pre::
  BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
  ::AddEntry((BasicIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_std::array<int,_3UL>_>
              *)CONCAT44(iVar1,in_stack_fffffffffffff810),be);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffff810));
  QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)CONCAT44(iVar1,in_stack_fffffffffffff810));
  return;
}

Assistant:

void ConvertRange(const ItemType& item, int i) {
    GetMC().TurnOffAutoLinking();     // for range only
    auto slk = int( GetMC().AddVar(0.0, item.ub()-item.lb()) );
    auto body = item.GetBody();
    body.add_term(1.0, slk);
    AlgConEQ lceq { std::move(body), item.ub() };
    int i1 = (int)GetMC().AddConstraint(std::move(lceq));
    GetSlackLink().AddEntry({i, i1, slk});
  }